

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall Catch::TextFlow::Column::Column(Column *this,string *text)

{
  pointer pcVar1;
  
  (this->m_string).m_string._M_dataplus._M_p = (pointer)&(this->m_string).m_string.field_2;
  pcVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + text->_M_string_length);
  (this->m_string).m_size = 0;
  AnsiSkippingString::preprocessString(&this->m_string);
  this->m_width = 0x4f;
  this->m_indent = 0;
  this->m_initialIndent = 0xffffffffffffffff;
  return;
}

Assistant:

explicit Column( std::string const& text ): m_string( text ) {}